

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseSwitchExpr(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  Parser *in_RSI;
  size_type __dnew;
  vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> cases;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [24];
  size_t local_c8;
  size_t local_c0;
  size_t sStack_b8;
  TokenType local_b0;
  col_t local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  size_t local_88;
  size_t sStack_80;
  TokenType local_78;
  col_t local_74;
  pointer local_70;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  size_t sStack_40;
  _Alloc_hider local_38;
  
  parseExpr((Parser *)(local_68 + 0x10));
  local_f0 = (undefined1  [8])local_e0;
  local_a8._8_8_ = (pointer)0x2b;
  local_f0 = (undefined1  [8])
             std::__cxx11::string::_M_create((ulong *)local_f0,(ulong)(local_a8 + 8));
  local_e0._0_8_ = local_a8._8_8_;
  builtin_strncpy((char *)((long)local_f0 + 0x1b),"expressi",8);
  builtin_strncpy((char *)((long)local_f0 + 0x23),"on body.",8);
  *(undefined8 *)((long)local_f0 + 0x10) = 0x746977732065726f;
  *(undefined8 *)((long)local_f0 + 0x18) = 0x6572707865206863;
  *(undefined8 *)local_f0 = 0x6465746365707845;
  *(undefined8 *)((long)local_f0 + 8) = 0x66656220277b2720;
  local_e8._M_p = (pointer)local_a8._8_8_;
  *(char *)((long)local_f0 + local_a8._8_8_) = '\0';
  expect(in_RSI,LEFT_BRACE,(string *)local_f0);
  local_50._0_8_ = this;
  if (local_f0 != (undefined1  [8])local_e0) {
    operator_delete((void *)local_f0,local_e0._0_8_ + 1);
  }
  local_50._8_8_ = (__node_base_ptr)0x0;
  sStack_40 = 0;
  local_38._M_p = (pointer)0x0;
  local_68._8_8_ = &(in_RSI->m_previous).line;
  do {
    while (TVar1 = (in_RSI->m_current).type, 0x2c < (int)TVar1) {
      if (TVar1 == DEFAULT) {
        advance(in_RSI);
        local_a8._8_4_ = (in_RSI->m_previous).type;
        local_98._0_8_ = &local_88;
        pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
        local_74 = *(col_t *)(local_68._8_8_ + 4);
        local_78 = *(TokenType *)local_68._8_8_;
        plVar4 = (long *)operator_new(0x38);
        local_f0._0_4_ = local_a8._8_4_;
        local_e8._M_p = local_e0 + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,local_98._0_8_,local_98._8_8_ + local_98._0_8_);
        *plVar4 = (long)&PTR__WildcardPattern_00127408;
        *(undefined4 *)(plVar4 + 1) = local_f0._0_4_;
        plVar4[2] = (long)(plVar4 + 4);
        if (local_e8._M_p == local_e0 + 8) {
          plVar4[4] = CONCAT44(local_e0._12_4_,local_e0._8_4_);
          plVar4[5] = local_e0._16_8_;
        }
        else {
          plVar4[2] = (long)local_e8._M_p;
          plVar4[4] = CONCAT44(local_e0._12_4_,local_e0._8_4_);
        }
        plVar4[3] = local_e0._0_8_;
        *(TokenType *)(plVar4 + 6) = local_78;
        *(col_t *)((long)plVar4 + 0x34) = local_74;
        if ((in_RSI->m_current).type == WHEN) {
          advance(in_RSI);
          parseExpr((Parser *)local_a8);
        }
        else {
          local_a8._0_8_ = operator_new(0x10);
          *(undefined ***)local_a8._0_8_ = &PTR__Expr_001273c0;
          *(undefined1 *)(local_a8._0_8_ + 8) = 1;
        }
        local_f0 = (undefined1  [8])local_e0;
        local_70 = (pointer)0x35;
        local_f0 = (undefined1  [8])
                   std::__cxx11::string::_M_create((ulong *)local_f0,(ulong)&local_70);
        local_e0._0_8_ = local_70;
        builtin_strncpy((char *)local_f0,"Expected \'{\' or \'=>\' before default switch case body."
                        ,0x35);
        local_e8._M_p = local_70;
        *(char *)((long)local_f0 + (long)local_70) = '\0';
        expectBlock((Parser *)local_68,(string *)in_RSI);
        if (local_f0 != (undefined1  [8])local_e0) {
          operator_delete((void *)local_f0,local_e0._0_8_ + 1);
        }
        local_e8._M_p = (pointer)local_a8._0_8_;
        local_e0._0_8_ = local_68._0_8_;
        local_e0._8_4_ = local_a8._8_4_;
        if ((size_t *)local_98._0_8_ == &local_88) {
          sStack_b8 = sStack_80;
          local_e0._16_8_ = &local_c0;
        }
        else {
          local_e0._16_8_ = local_98._0_8_;
        }
        local_c0 = CONCAT71(local_88._1_7_,(undefined1)local_88);
        local_c8 = local_98._8_8_;
        local_98._8_8_ = 0;
        local_88._0_1_ = '\0';
        local_ac = local_74;
        local_b0 = local_78;
        local_f0 = (undefined1  [8])plVar4;
        local_98._0_8_ = &local_88;
        std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::
        emplace_back<enact::SwitchCase>
                  ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)(local_50 + 8),
                   (SwitchCase *)local_f0);
LAB_0010d224:
        if ((size_t *)local_e0._16_8_ != &local_c0) {
          operator_delete((void *)local_e0._16_8_,local_c0 + 1);
        }
        if ((long *)local_e0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_e0._0_8_ + 8))();
        }
        local_e0._0_8_ = 0;
        if ((long *)local_e8._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_e8._M_p + 8))();
        }
        local_e8._M_p = (pointer)0x0;
        if (local_f0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_f0 + 8))();
        }
        if ((size_t *)local_98._0_8_ != &local_88) {
          operator_delete((void *)local_98._0_8_,CONCAT71(local_88._1_7_,(undefined1)local_88) + 1);
        }
      }
      else if (TVar1 == END_OF_FILE) goto LAB_0010d2a2;
    }
    if (TVar1 == CASE) {
      advance(in_RSI);
      local_a8._8_4_ = (in_RSI->m_previous).type;
      local_98._0_8_ = &local_88;
      pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
      local_74 = *(col_t *)(local_68._8_8_ + 4);
      local_78 = *(TokenType *)local_68._8_8_;
      parseExpr((Parser *)local_f0);
      plVar4 = (long *)operator_new(0x10);
      *plVar4 = (long)&PTR__ValuePattern_00127368;
      plVar4[1] = (long)local_f0;
      if ((in_RSI->m_current).type == WHEN) {
        advance(in_RSI);
        parseExpr((Parser *)local_a8);
      }
      else {
        local_a8._0_8_ = operator_new(0x10);
        *(undefined ***)local_a8._0_8_ = &PTR__Expr_001273c0;
        *(undefined1 *)(local_a8._0_8_ + 8) = 1;
      }
      local_f0 = (undefined1  [8])local_e0;
      local_70 = (pointer)0x2d;
      local_f0 = (undefined1  [8])
                 std::__cxx11::string::_M_create((ulong *)local_f0,(ulong)&local_70);
      local_e0._0_8_ = local_70;
      builtin_strncpy((char *)local_f0,"Expected \'{\' or \'=>\' before switch case body.",0x2d);
      local_e8._M_p = local_70;
      *(char *)((long)local_f0 + (long)local_70) = '\0';
      expectBlock((Parser *)local_68,(string *)in_RSI);
      if (local_f0 != (undefined1  [8])local_e0) {
        operator_delete((void *)local_f0,local_e0._0_8_ + 1);
      }
      local_e8._M_p = (pointer)local_a8._0_8_;
      local_e0._0_8_ = local_68._0_8_;
      local_e0._8_4_ = local_a8._8_4_;
      if ((size_t *)local_98._0_8_ == &local_88) {
        sStack_b8 = sStack_80;
        local_e0._16_8_ = &local_c0;
      }
      else {
        local_e0._16_8_ = local_98._0_8_;
      }
      local_c0 = CONCAT71(local_88._1_7_,(undefined1)local_88);
      local_c8 = local_98._8_8_;
      local_98._8_8_ = 0;
      local_88._0_1_ = '\0';
      local_ac = local_74;
      local_b0 = local_78;
      local_f0 = (undefined1  [8])plVar4;
      local_98._0_8_ = &local_88;
      std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::
      emplace_back<enact::SwitchCase>
                ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)(local_50 + 8),
                 (SwitchCase *)local_f0);
      goto LAB_0010d224;
    }
  } while (TVar1 != RIGHT_BRACE);
LAB_0010d2a2:
  local_f0 = (undefined1  [8])local_e0;
  local_a8._8_8_ = (pointer)0x2a;
  local_f0 = (undefined1  [8])
             std::__cxx11::string::_M_create((ulong *)local_f0,(ulong)(local_a8 + 8));
  local_e0._0_8_ = local_a8._8_8_;
  builtin_strncpy((char *)local_f0,"Expected \'}\' after switch expression body.",0x2a);
  local_e8._M_p = (pointer)local_a8._8_8_;
  *(char *)((long)local_f0 + local_a8._8_8_) = '\0';
  expect(in_RSI,RIGHT_BRACE,(string *)local_f0);
  uVar3 = local_50._0_8_;
  if (local_f0 != (undefined1  [8])local_e0) {
    operator_delete((void *)local_f0,local_e0._0_8_ + 1);
  }
  puVar5 = (undefined8 *)operator_new(0x28);
  *puVar5 = &PTR__SwitchExpr_00127450;
  puVar5[1] = local_68._16_8_;
  puVar5[2] = local_50._8_8_;
  puVar5[3] = sStack_40;
  puVar5[4] = local_38._M_p;
  local_50._8_8_ = (__node_base_ptr)0x0;
  sStack_40 = 0;
  local_38._M_p = (pointer)0x0;
  *(undefined8 **)uVar3 = puVar5;
  std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::~vector
            ((vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *)(local_50 + 8));
  return (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>)(Expr *)uVar3;
}

Assistant:

std::unique_ptr<Expr> Parser::parseSwitchExpr() {
        std::unique_ptr<Expr> value = parseExpr();
        expect(TokenType::LEFT_BRACE, "Expected '{' before switch expression body.");

        std::vector<SwitchCase> cases;
        while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
            if (consume(TokenType::CASE)) {
                Token keyword = m_previous;

                // TODO: add more pattern types
                std::unique_ptr<Pattern> casePattern = std::make_unique<ValuePattern>(parseExpr());
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                    ? parseExpr()
                                                    : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern), std::move(casePredicate), std::move(caseBody), std::move(keyword)});
            } else if (consume(TokenType::DEFAULT)) {
                Token keyword = m_previous;

                std::unique_ptr<Pattern> casePattern = std::make_unique<WildcardPattern>(keyword);
                std::unique_ptr<Expr> casePredicate = consume(TokenType::WHEN)
                                                      ? parseExpr()
                                                      : std::make_unique<BooleanExpr>(true);
                std::unique_ptr<BlockExpr> caseBody = expectBlock("Expected '{' or '=>' before default switch case body.");

                cases.push_back(SwitchCase{std::move(casePattern),
                                           std::move(casePredicate),
                                           std::move(caseBody),
                                           std::move(keyword)});
            }
        }

        expect(TokenType::RIGHT_BRACE, "Expected '}' after switch expression body.");

        return std::make_unique<SwitchExpr>(std::move(value), std::move(cases));
    }